

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManEquivDeriveReprs(Gia_Man_t *p,Gia_Man_t *pNew,Gia_Man_t *pFinal)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  Gia_Rpr_t *pGVar4;
  long lVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t __nmemb;
  int iVar11;
  uint uVar12;
  uint uVar13;
  
  iVar11 = pFinal->nObjs;
  pGVar4 = (Gia_Rpr_t *)calloc((long)iVar11,4);
  pFinal->pReprs = pGVar4;
  if (0 < (long)iVar11) {
    lVar5 = 0;
    do {
      pFinal->pReprs[lVar5] = (Gia_Rpr_t)((uint)pFinal->pReprs[lVar5] | 0xfffffff);
      lVar5 = lVar5 + 1;
    } while (lVar5 < pFinal->nObjs);
  }
  iVar11 = p->nObjs;
  if (iVar11 < 2) {
    bVar3 = false;
  }
  else {
    lVar5 = 1;
    lVar7 = 5;
    do {
      if ((((uint)p->pReprs[lVar5] & 0xfffffff) == 0) &&
         (uVar12 = *(uint *)(&p->pObjs->field_0x0 + lVar7 * 4), uVar12 != 0xffffffff)) {
        if ((int)uVar12 < 0) {
LAB_001fea82:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (pNew->nObjs <= (int)(uVar12 >> 1)) {
LAB_001fea63:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar12 = pNew->pObjs[uVar12 >> 1].Value;
        if ((int)uVar12 < 0) goto LAB_001fea82;
        if (1 < uVar12) {
          pFinal->pReprs[uVar12 >> 1] = (Gia_Rpr_t)((uint)pFinal->pReprs[uVar12 >> 1] & 0xf0000000);
          iVar11 = p->nObjs;
        }
      }
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 3;
    } while (lVar5 < iVar11);
    bVar3 = 1 < iVar11;
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  if (bVar3) {
    uVar10 = 1;
    do {
      if (((~(uint)p->pReprs[uVar10] & 0xfffffff) == 0) && (piVar6 = p->pNexts, 0 < piVar6[uVar10]))
      {
        p_00->nSize = 0;
        uVar8 = uVar10 & 0xffffffff;
        do {
          if (p->nObjs <= (int)uVar8) goto LAB_001fea63;
          uVar12 = p->pObjs[uVar8].Value;
          if (uVar12 != 0xffffffff) {
            if ((int)uVar12 < 0) goto LAB_001fea82;
            if (pNew->nObjs <= (int)(uVar12 >> 1)) goto LAB_001fea63;
            uVar12 = pNew->pObjs[uVar12 >> 1].Value;
            if ((int)uVar12 < 0) goto LAB_001fea82;
            uVar12 = uVar12 >> 1;
            if (0 < (long)p_00->nSize) {
              lVar5 = 0;
              do {
                if (p_00->pArray[lVar5] == uVar12) goto LAB_001fe98d;
                lVar5 = lVar5 + 1;
              } while (p_00->nSize != lVar5);
            }
            Vec_IntPush(p_00,uVar12);
            piVar6 = p->pNexts;
          }
LAB_001fe98d:
          puVar2 = (uint *)(piVar6 + uVar8);
          uVar8 = (ulong)*puVar2;
        } while (0 < (int)*puVar2);
        __nmemb = (size_t)p_00->nSize;
        if (1 < (long)__nmemb) {
          puVar2 = (uint *)p_00->pArray;
          qsort(puVar2,__nmemb,4,Vec_IntSortCompare1);
          uVar12 = *puVar2;
          sVar9 = 1;
          uVar13 = uVar12;
          do {
            uVar1 = puVar2[sVar9];
            if ((uVar12 != 0xfffffff) && ((int)uVar1 <= (int)uVar12)) {
              __assert_fail("Num == GIA_VOID || Num < Id",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
            }
            pFinal->pReprs[(int)uVar1] =
                 (Gia_Rpr_t)((uint)pFinal->pReprs[(int)uVar1] & 0xf0000000 | uVar12 & 0xfffffff);
            if ((int)uVar1 <= (int)uVar13) {
              __assert_fail("iPrev < iNode",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                            ,0x392,
                            "void Gia_ManEquivDeriveReprs(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *)");
            }
            sVar9 = sVar9 + 1;
            uVar13 = uVar1;
          } while (__nmemb != sVar9);
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)p->nObjs);
    piVar6 = p_00->pArray;
  }
  if (piVar6 != (int *)0x0) {
    free(piVar6);
  }
  free(p_00);
  piVar6 = Gia_ManDeriveNexts(pFinal);
  pFinal->pNexts = piVar6;
  return;
}

Assistant:

void Gia_ManEquivDeriveReprs( Gia_Man_t * p, Gia_Man_t * pNew, Gia_Man_t * pFinal )
{
    Vec_Int_t * vClass;
    Gia_Obj_t * pObj, * pObjNew;
    int i, k, iNode, iRepr, iPrev;
    // start representatives
    pFinal->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pFinal) );
    for ( i = 0; i < Gia_ManObjNum(pFinal); i++ )
        Gia_ObjSetRepr( pFinal, i, GIA_VOID );
    // iterate over constant candidates
    Gia_ManForEachConst( p, i )
    {
        pObj = Gia_ManObj( p, i );
        if ( !~pObj->Value )
            continue;
        pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( Abc_Lit2Var(pObjNew->Value) == 0 )
            continue;
        Gia_ObjSetRepr( pFinal, Abc_Lit2Var(pObjNew->Value), 0 );
    }
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        Gia_ClassForEachObj( p, i, k )
        {
            pObj = Gia_ManObj( p, k );
            if ( !~pObj->Value )
                continue;
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
            Vec_IntPushUnique( vClass, Abc_Lit2Var(pObjNew->Value) );
        }
        if ( Vec_IntSize( vClass ) < 2 )
            continue;
        Vec_IntSort( vClass, 0 );
        iRepr = iPrev = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryStart( vClass, iNode, k, 1 )
        {
            Gia_ObjSetRepr( pFinal, iNode, iRepr );
            assert( iPrev < iNode );
            iPrev = iNode;
        }
    }
    Vec_IntFree( vClass );
    pFinal->pNexts = Gia_ManDeriveNexts( pFinal );
}